

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

ImageChannelValues * __thiscall
pbrt::Image::Average(ImageChannelValues *__return_storage_ptr__,Image *this,ImageChannelDesc *desc)

{
  float *pfVar1;
  pointer pdVar2;
  size_t sVar3;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar12;
  float *pfVar13;
  Tuple2<pbrt::Point2,_int> TVar14;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar15;
  size_t sVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  vector<double,_std::allocator<double>_> sum;
  ImageChannelValues v;
  long local_90;
  float local_84;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *local_80;
  vector<double,_std::allocator<double>_> local_78;
  undefined1 local_60 [48];
  
  local_60._0_8_ = (memory_resource *)0x0;
  local_80 = &__return_storage_ptr__->
              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_78,(desc->offset).nStored,(value_type_conflict4 *)local_60,
             (allocator_type *)&local_84);
  TVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
  if (0 < TVar14.y) {
    local_90 = 0;
    do {
      if (0 < TVar14.x) {
        uVar17 = 0;
        do {
          GetChannels((ImageChannelValues *)local_60,this,(Point2i)(local_90 << 0x20 | uVar17),desc,
                      (WrapMode2D)0x200000002);
          auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          sVar3 = (desc->offset).nStored;
          if (sVar3 != 0) {
            pfVar13 = (float *)local_60._8_8_;
            if ((float *)local_60._8_8_ == (float *)0x0) {
              pfVar13 = (float *)(local_60 + 0x10);
            }
            auVar21 = vpbroadcastq_avx512f();
            uVar18 = 0;
            do {
              auVar22 = vpbroadcastq_avx512f();
              auVar22 = vporq_avx512f(auVar22,auVar20);
              uVar11 = vpcmpuq_avx512f(auVar22,auVar21,2);
              pfVar1 = pfVar13 + uVar18;
              bVar4 = (byte)uVar11;
              auVar19._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * (int)pfVar1[1];
              auVar19._0_4_ = (uint)(bVar4 & 1) * (int)*pfVar1;
              auVar19._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * (int)pfVar1[2];
              auVar19._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * (int)pfVar1[3];
              auVar19._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * (int)pfVar1[4];
              auVar19._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * (int)pfVar1[5];
              auVar19._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * (int)pfVar1[6];
              auVar19._28_4_ = (uint)(byte)(uVar11 >> 7) * (int)pfVar1[7];
              pdVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar18;
              auVar22._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar2[1];
              auVar22._0_8_ = (ulong)(bVar4 & 1) * (long)*pdVar2;
              auVar22._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar2[2];
              auVar22._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar2[3];
              auVar22._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar2[4];
              auVar22._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar2[5];
              auVar22._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar2[6];
              auVar22._56_8_ = (uVar11 >> 7) * (long)pdVar2[7];
              auVar23 = vcvtps2pd_avx512f(auVar19);
              auVar22 = vaddpd_avx512f(auVar22,auVar23);
              pdVar2 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar18;
              bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
              *pdVar2 = (double)((ulong)(bVar4 & 1) * auVar22._0_8_ |
                                (ulong)!(bool)(bVar4 & 1) * (long)*pdVar2);
              pdVar2[1] = (double)((ulong)bVar5 * auVar22._8_8_ | (ulong)!bVar5 * (long)pdVar2[1]);
              pdVar2[2] = (double)((ulong)bVar6 * auVar22._16_8_ | (ulong)!bVar6 * (long)pdVar2[2]);
              pdVar2[3] = (double)((ulong)bVar7 * auVar22._24_8_ | (ulong)!bVar7 * (long)pdVar2[3]);
              pdVar2[4] = (double)((ulong)bVar8 * auVar22._32_8_ | (ulong)!bVar8 * (long)pdVar2[4]);
              pdVar2[5] = (double)((ulong)bVar9 * auVar22._40_8_ | (ulong)!bVar9 * (long)pdVar2[5]);
              pdVar2[6] = (double)((ulong)bVar10 * auVar22._48_8_ | (ulong)!bVar10 * (long)pdVar2[6]
                                  );
              pdVar2[7] = (double)((uVar11 >> 7) * auVar22._56_8_ |
                                  (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar2[7]);
              uVar18 = uVar18 + 8;
            } while ((sVar3 + 7 & 0xfffffffffffffff8) != uVar18);
          }
          InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                    ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)local_60);
          TVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
          uVar17 = uVar17 + 1;
        } while ((long)uVar17 < (long)TVar14.x);
      }
      local_90 = local_90 + 1;
    } while (local_90 < (long)TVar14 >> 0x20);
  }
  sVar3 = (desc->offset).nStored;
  local_84 = 0.0;
  local_60._0_8_ = pstd::pmr::new_delete_resource();
  pIVar12 = local_80;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
            (local_80,sVar3,&local_84,(polymorphic_allocator<float> *)local_60);
  sVar3 = (desc->offset).nStored;
  if (sVar3 == 0) {
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) {
      return (ImageChannelValues *)pIVar12;
    }
  }
  else {
    paVar15 = &pIVar12->field_2;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)pIVar12->ptr !=
        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)0x0) {
      paVar15 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)pIVar12->ptr;
    }
    sVar16 = 0;
    do {
      TVar14 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
      paVar15->fixed[sVar16] =
           (float)(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar16] / (double)(TVar14.y * TVar14.x));
      sVar16 = sVar16 + 1;
    } while (sVar3 != sVar16);
  }
  operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return (ImageChannelValues *)pIVar12;
}

Assistant:

ImageChannelValues Image::Average(const ImageChannelDesc &desc) const {
    std::vector<double> sum(desc.size(), 0.);

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            for (int c = 0; c < desc.size(); ++c)
                sum[c] += v[c];
        }

    ImageChannelValues average(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        average[c] = sum[c] / (Resolution().x * Resolution().y);
    return average;
}